

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O2

Offset wabt::WriteFixedU32Leb128At(Stream *stream,Offset offset,uint32_t value,char *desc)

{
  uint8_t data [5];
  
  data[0] = (byte)value | 0x80;
  data[1] = (byte)(value >> 7) | 0x80;
  data[2] = (byte)(value >> 0xe) | 0x80;
  data[3] = (byte)(value >> 0x15) | 0x80;
  data[4] = (uint8_t)(value >> 0x1c);
  Stream::WriteDataAt(stream,offset,data,5,desc,No);
  return 5;
}

Assistant:

Offset WriteFixedU32Leb128At(Stream* stream,
                             Offset offset,
                             uint32_t value,
                             const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length =
      WriteFixedU32Leb128Raw(data, data + MAX_U32_LEB128_BYTES, value);
  stream->WriteDataAt(offset, data, length, desc);
  return length;
}